

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O1

void __thiscall
ary::KeypointTrackingLocalizer::KeypointTrackingLocalizer
          (KeypointTrackingLocalizer *this,SharedCameraModel *camera)

{
  PlaneTracker *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  Localizer::Localizer(&this->super_Localizer,camera);
  (this->super_Localizer).super_CameraUser._vptr_CameraUser =
       (_func_int **)&PTR__KeypointTrackingLocalizer_001269c0;
  cv::Mat::Mat(&this->mask);
  *(undefined8 *)
   ((long)&(this->tracker).super_shared_ptr<ary::PlaneTracker>.
           super___shared_ptr<ary::PlaneTracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tracker).super_shared_ptr<ary::PlaneTracker>.
           super___shared_ptr<ary::PlaneTracker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4)
       = 0;
  (this->verifier).
  super__Vector_base<cv::Ptr<ary::TemplatePlaneVerifier>,_std::allocator<cv::Ptr<ary::TemplatePlaneVerifier>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tracker).super_shared_ptr<ary::PlaneTracker>.
  super___shared_ptr<ary::PlaneTracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->verifier).
  super__Vector_base<cv::Ptr<ary::TemplatePlaneVerifier>,_std::allocator<cv::Ptr<ary::TemplatePlaneVerifier>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verifier).
  super__Vector_base<cv::Ptr<ary::TemplatePlaneVerifier>,_std::allocator<cv::Ptr<ary::TemplatePlaneVerifier>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->localizer).super_shared_ptr<ary::KeypointPlaneLocalizer>.
  super___shared_ptr<ary::KeypointPlaneLocalizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->localizer).super_shared_ptr<ary::KeypointPlaneLocalizer>.
  super___shared_ptr<ary::KeypointPlaneLocalizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->localization).super_shared_ptr<ary::Localization>.
  super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->localization).super_shared_ptr<ary::Localization>.
  super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->tracking_select = -1;
  this_00 = (PlaneTracker *)operator_new(0x1c0);
  PlaneTracker::PlaneTracker(this_00,camera);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ary::PlaneTracker*>
            (&local_28,this_00);
  (this->tracker).super_shared_ptr<ary::PlaneTracker>.
  super___shared_ptr<ary::PlaneTracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->tracker).super_shared_ptr<ary::PlaneTracker>.
              super___shared_ptr<ary::PlaneTracker,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_28);
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return;
}

Assistant:

KeypointTrackingLocalizer::KeypointTrackingLocalizer(const SharedCameraModel& camera) : Localizer(camera), tracking_timeout(0), tracking_select(-1) {

#if CV_MAJOR_VERSION == 2
    localizer = Ptr<KeypointPlaneLocalizer>(new KeypointPlaneLocalizer(camera, ary::ORB));
#elif CV_MAJOR_VERSION == 3
    localizer = Ptr<KeypointPlaneLocalizer>(new KeypointPlaneLocalizer(camera, ary::AKAZE));
#endif

    tracker = Ptr<PlaneTracker>(new PlaneTracker(camera));
}